

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O2

int file_list(int pi,char *fpat,char *buf,uint count)

{
  int sent;
  size_t sVar1;
  gpioExtent_t ext [1];
  
  sVar1 = strlen(fpat);
  ext[0].size = (size_t)(int)sVar1;
  ext[0].ptr = fpat;
  sent = pigpio_command_ext(pi,0x6d,60000,0,(int)sVar1,1,ext,0);
  if (0 < sent) {
    sent = recvMax(pi,buf,count,sent);
  }
  _pmu(pi);
  return sent;
}

Assistant:

int file_list(int pi, char *fpat,  char *buf, unsigned count)
{
   int len;
   int bytes;
   gpioExtent_t ext[1];

   len = strlen(fpat);

   /*
   p1=60000
   p2=0
   p3=len
   ## extension ##
   char fpat[len]
   */

   ext[0].size = len;
   ext[0].ptr = fpat;

   bytes = pigpio_command_ext(pi, PI_CMD_FL, 60000, 0, len, 1, ext, 0);

   if (bytes > 0)
   {
      bytes = recvMax(pi, buf, count, bytes);
   }

   _pmu(pi);

   return bytes;
}